

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

void __thiscall higan::FileForAppend::Append(FileForAppend *this,char *data,size_t len)

{
  pointer pcVar1;
  FILE *__stream;
  int __errnum;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  
  sVar2 = Write(this,data,len);
  do {
    uVar3 = sVar2;
    if (len < uVar3 || len - uVar3 == 0) goto LAB_0010fa18;
    sVar4 = Write(this,data + uVar3,len - uVar3);
    sVar2 = sVar4 + uVar3;
  } while (sVar4 != 0);
  __errnum = ferror((FILE *)this->file_fp_);
  __stream = _stderr;
  if (__errnum != 0) {
    pcVar1 = (this->url_)._M_dataplus._M_p;
    pcVar5 = strerror(__errnum);
    fprintf(__stream,"write file %s error error msg is: %s",pcVar1,pcVar5);
  }
LAB_0010fa18:
  this->write_sum_bytes_ = this->write_sum_bytes_ + uVar3;
  return;
}

Assistant:

void FileForAppend::Append(const char* data, size_t len)
{
	size_t has_writen = 0;
	/**
	 * 默认第一次 成功..
	 */
	size_t write_result = Write(data, len);

	has_writen += write_result;

	while (has_writen < len)
	{
		write_result = Write(data + has_writen, len - has_writen);
		if (write_result > 0)
		{
			has_writen += write_result;
		}
		else if (write_result == 0)
		{
			int error = ferror(file_fp_);
			if (error)
			{
				fprintf(stderr, "write file %s error error msg is: %s",
						url_.c_str(), strerror(error));
			}
			break;
		}
	}

	write_sum_bytes_ += has_writen;
}